

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_blocked_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_blocked_sse41_128_16
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  undefined4 *puVar1;
  int *piVar2;
  int iVar3;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *ptr_01;
  parasail_result_t *ppVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  size_t size;
  long lVar11;
  long lVar12;
  ulong uVar13;
  __m128i *palVar14;
  long lVar15;
  long lVar16;
  undefined2 uVar17;
  __m128i extraout_XMM0;
  __m128i alVar18;
  undefined1 auVar19 [16];
  short sVar20;
  undefined1 in_XMM1 [16];
  undefined1 auVar21 [16];
  short sVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  __m128i_16_t h;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  ushort uVar35;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  undefined1 auVar36 [16];
  ushort uVar43;
  ushort uVar44;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  short sVar53;
  short sVar54;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  undefined1 auVar55 [16];
  short sVar63;
  undefined1 auVar56 [16];
  undefined1 auVar64 [16];
  short sVar65;
  __m128i_16_t t;
  __m128i local_48;
  
  uVar6 = s1Len + 0xe;
  if (-1 < (int)(s1Len + 7U)) {
    uVar6 = s1Len + 7U;
  }
  uVar10 = (int)uVar6 >> 3;
  ptr = parasail_memalign___m128i(0x10,(long)(int)((uVar6 & 0xfffffff8) * 3));
  size = (size_t)(int)uVar10;
  ptr_00 = parasail_memalign___m128i(0x10,size);
  ptr_01 = parasail_memalign___m128i(0x10,size);
  ppVar4 = parasail_result_new_table1(uVar6 & 0xfffffff8,s2Len);
  uVar6 = 1;
  if (1 < (int)uVar10) {
    uVar6 = uVar10;
  }
  iVar8 = 0;
  lVar11 = 0;
  alVar18 = extraout_XMM0;
  do {
    iVar8 = iVar8 + 1;
    while (s1Len < 1) {
      iVar8 = iVar8 + 1;
      if (iVar8 == 0x19) {
        auVar19 = pshuflw((undefined1  [16])alVar18,ZEXT416((uint)open),0);
        auVar19._4_4_ = auVar19._0_4_;
        auVar19._8_4_ = auVar19._0_4_;
        auVar19._12_4_ = auVar19._0_4_;
        auVar21 = pshuflw(in_XMM1,ZEXT416((uint)gap),0);
        auVar21._4_4_ = auVar21._0_4_;
        auVar21._8_4_ = auVar21._0_4_;
        auVar21._12_4_ = auVar21._0_4_;
        goto LAB_006cbb1d;
      }
    }
    lVar11 = (long)(int)lVar11;
    lVar12 = 0;
    uVar10 = 0;
    do {
      lVar15 = 0;
      lVar16 = lVar12;
      do {
        if (lVar16 < s1Len) {
          uVar17 = (undefined2)
                   matrix->matrix[(long)matrix->mapper[(byte)s1[lVar16]] * (long)matrix->size];
        }
        else {
          uVar17 = 0;
        }
        *(undefined2 *)((long)local_48 + lVar15) = uVar17;
        lVar16 = lVar16 + 1;
        lVar15 = lVar15 + 2;
      } while (lVar15 != 0x10);
      ptr[lVar11] = local_48;
      lVar11 = lVar11 + 1;
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 8;
    } while (uVar10 != uVar6);
    alVar18 = local_48;
  } while (iVar8 != 0x18);
  auVar19 = pshuflw((undefined1  [16])local_48,ZEXT416((uint)open),0);
  auVar19._4_4_ = auVar19._0_4_;
  auVar19._8_4_ = auVar19._0_4_;
  auVar19._12_4_ = auVar19._0_4_;
  auVar21 = pshuflw(in_XMM1,ZEXT416((uint)gap),0);
  auVar21._4_4_ = auVar21._0_4_;
  auVar21._8_4_ = auVar21._0_4_;
  auVar21._12_4_ = auVar21._0_4_;
  if (0 < s1Len) {
    auVar24 = pshuflw(ZEXT416((uint)-open),ZEXT416((uint)-open),0);
    uVar23 = auVar24._0_4_;
    lVar11 = 0;
    do {
      *(undefined1 (*) [16])((long)*ptr_00 + lVar11) = (undefined1  [16])0x0;
      puVar1 = (undefined4 *)((long)*ptr_01 + lVar11);
      *puVar1 = uVar23;
      puVar1[1] = uVar23;
      puVar1[2] = uVar23;
      puVar1[3] = uVar23;
      lVar11 = lVar11 + 0x10;
    } while ((ulong)uVar6 << 4 != lVar11);
  }
LAB_006cbb1d:
  if (s2Len < 1) {
    auVar24 = (undefined1  [16])0x0;
  }
  else {
    sVar20 = auVar21._0_2_;
    sVar26 = auVar19._14_2_;
    sVar22 = auVar21._14_2_;
    uVar5 = (ulong)(uint)s2Len;
    uVar9 = 0;
    auVar24 = (undefined1  [16])0x0;
    do {
      if (0 < s1Len) {
        iVar8 = matrix->mapper[(byte)s2[uVar9]];
        auVar36 = (undefined1  [16])0x0;
        uVar13 = 0;
        auVar25 = auVar24;
        uVar44 = 0xc000;
        do {
          alVar18 = ptr_00[uVar13];
          palVar14 = ptr_01 + uVar13;
          sVar27 = (short)(*palVar14)[0];
          sVar28 = *(short *)((long)*palVar14 + 2);
          sVar29 = *(short *)((long)*palVar14 + 4);
          sVar30 = *(short *)((long)*palVar14 + 6);
          sVar31 = (short)(*palVar14)[1];
          sVar32 = *(short *)((long)*palVar14 + 10);
          sVar33 = *(short *)((long)*palVar14 + 0xc);
          sVar34 = *(short *)((long)*palVar14 + 0xe);
          auVar55._0_8_ = alVar18[0] << 0x10;
          auVar55._8_8_ = alVar18[1] << 0x10 | alVar18[0] >> 0x30;
          auVar55 = auVar55 | auVar36;
          palVar14 = ptr + (long)iVar8 * size + uVar13;
          sVar54 = auVar55._0_2_ + (short)(*palVar14)[0];
          sVar57 = auVar55._2_2_ + *(short *)((long)*palVar14 + 2);
          sVar58 = auVar55._4_2_ + *(short *)((long)*palVar14 + 4);
          sVar59 = auVar55._6_2_ + *(short *)((long)*palVar14 + 6);
          sVar60 = auVar55._8_2_ + (short)(*palVar14)[1];
          sVar61 = auVar55._10_2_ + *(short *)((long)*palVar14 + 10);
          sVar62 = auVar55._12_2_ + *(short *)((long)*palVar14 + 0xc);
          sVar63 = auVar55._14_2_ + *(short *)((long)*palVar14 + 0xe);
          sVar47 = (ushort)(-1 < sVar27) * sVar27;
          sVar65 = (ushort)(-1 < sVar28) * sVar28;
          sVar53 = (ushort)(-1 < sVar29) * sVar29;
          sVar52 = (ushort)(-1 < sVar30) * sVar30;
          sVar51 = (ushort)(-1 < sVar31) * sVar31;
          sVar49 = (ushort)(-1 < sVar32) * sVar32;
          sVar50 = (ushort)(-1 < sVar33) * sVar33;
          sVar48 = (ushort)(-1 < sVar34) * sVar34;
          uVar35 = (ushort)(sVar47 < sVar54) * sVar54 | (ushort)(sVar47 >= sVar54) * sVar47;
          uVar37 = (ushort)(sVar65 < sVar57) * sVar57 | (ushort)(sVar65 >= sVar57) * sVar65;
          uVar38 = (ushort)(sVar53 < sVar58) * sVar58 | (ushort)(sVar53 >= sVar58) * sVar53;
          uVar39 = (ushort)(sVar52 < sVar59) * sVar59 | (ushort)(sVar52 >= sVar59) * sVar52;
          uVar40 = (ushort)(sVar51 < sVar60) * sVar60 | (ushort)(sVar51 >= sVar60) * sVar51;
          uVar41 = (ushort)(sVar49 < sVar61) * sVar61 | (ushort)(sVar49 >= sVar61) * sVar49;
          uVar42 = (ushort)(sVar50 < sVar62) * sVar62 | (ushort)(sVar50 >= sVar62) * sVar50;
          uVar43 = (ushort)(sVar48 < sVar63) * sVar63 | (ushort)(sVar48 >= sVar63) * sVar48;
          auVar36._0_2_ = uVar44 - auVar19._0_2_;
          auVar36._2_2_ = uVar35 - auVar19._2_2_;
          auVar36._4_2_ = uVar37 - auVar19._4_2_;
          auVar36._6_2_ = uVar38 - auVar19._6_2_;
          auVar36._8_2_ = uVar39 - auVar19._8_2_;
          auVar36._10_2_ = uVar40 - auVar19._10_2_;
          auVar36._12_2_ = uVar41 - auVar19._12_2_;
          auVar36._14_2_ = uVar42 - sVar26;
          auVar45._0_2_ = -(ushort)(0 < auVar36._0_2_);
          auVar45._2_2_ = -(ushort)(0 < auVar36._2_2_);
          auVar45._4_2_ = -(ushort)(0 < auVar36._4_2_);
          auVar45._6_2_ = -(ushort)(0 < auVar36._6_2_);
          auVar45._8_2_ = -(ushort)(0 < auVar36._8_2_);
          auVar45._10_2_ = -(ushort)(0 < auVar36._10_2_);
          auVar45._12_2_ = -(ushort)(0 < auVar36._12_2_);
          auVar45._14_2_ = -(ushort)(0 < auVar36._14_2_);
          auVar24 = auVar36;
          uVar44 = uVar43;
          if ((((((((((((((((auVar45 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar45 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar45 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar45 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar45 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar45 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar45 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar45 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar45 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar45 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar45 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar45._14_2_ >> 7 & 1) != 0) || (auVar45._14_2_ & 0x8000) != 0) {
            do {
              sVar65 = -sVar20;
              auVar56._2_2_ = auVar36._0_2_ - auVar21._2_2_;
              auVar56._0_2_ = sVar65;
              auVar56._4_2_ = auVar36._2_2_ - auVar21._4_2_;
              auVar56._6_2_ = auVar36._4_2_ - auVar21._6_2_;
              auVar56._8_2_ = auVar36._6_2_ - auVar21._8_2_;
              auVar56._10_2_ = auVar36._8_2_ - auVar21._10_2_;
              auVar56._12_2_ = auVar36._10_2_ - auVar21._12_2_;
              auVar56._14_2_ = auVar36._12_2_ - sVar22;
              sVar47 = auVar24._0_2_;
              auVar64._0_2_ =
                   (ushort)(sVar47 < sVar65) * sVar65 | (ushort)(sVar47 >= sVar65) * sVar47;
              sVar65 = auVar24._2_2_;
              auVar64._2_2_ =
                   (ushort)(sVar65 < auVar56._2_2_) * auVar56._2_2_ |
                   (ushort)(sVar65 >= auVar56._2_2_) * sVar65;
              sVar65 = auVar24._4_2_;
              auVar64._4_2_ =
                   (ushort)(sVar65 < auVar56._4_2_) * auVar56._4_2_ |
                   (ushort)(sVar65 >= auVar56._4_2_) * sVar65;
              sVar65 = auVar24._6_2_;
              auVar64._6_2_ =
                   (ushort)(sVar65 < auVar56._6_2_) * auVar56._6_2_ |
                   (ushort)(sVar65 >= auVar56._6_2_) * sVar65;
              sVar65 = auVar24._8_2_;
              auVar64._8_2_ =
                   (ushort)(sVar65 < auVar56._8_2_) * auVar56._8_2_ |
                   (ushort)(sVar65 >= auVar56._8_2_) * sVar65;
              sVar65 = auVar24._10_2_;
              auVar64._10_2_ =
                   (ushort)(sVar65 < auVar56._10_2_) * auVar56._10_2_ |
                   (ushort)(sVar65 >= auVar56._10_2_) * sVar65;
              sVar65 = auVar24._12_2_;
              sVar47 = auVar24._14_2_;
              auVar64._12_2_ =
                   (ushort)(sVar65 < auVar56._12_2_) * auVar56._12_2_ |
                   (ushort)(sVar65 >= auVar56._12_2_) * sVar65;
              auVar64._14_2_ =
                   (ushort)(sVar47 < auVar56._14_2_) * auVar56._14_2_ |
                   (ushort)(sVar47 >= auVar56._14_2_) * sVar47;
              auVar46._0_2_ = -(ushort)(sVar20 < 0);
              auVar46._2_2_ = -(ushort)(0 < auVar56._2_2_);
              auVar46._4_2_ = -(ushort)(0 < auVar56._4_2_);
              auVar46._6_2_ = -(ushort)(0 < auVar56._6_2_);
              auVar46._8_2_ = -(ushort)(0 < auVar56._8_2_);
              auVar46._10_2_ = -(ushort)(0 < auVar56._10_2_);
              auVar46._12_2_ = -(ushort)(0 < auVar56._12_2_);
              auVar46._14_2_ = -(ushort)(0 < auVar56._14_2_);
              auVar36 = auVar56;
              auVar24 = auVar64;
            } while ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  || (auVar46 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                 (auVar46 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar46 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar46 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar46 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar46 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar46 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar46 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar46 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar46 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar46 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar46._14_2_ >> 7 & 1) != 0) || (auVar46._14_2_ & 0x8000) != 0);
            uVar35 = ((short)uVar35 < (short)auVar64._0_2_) * auVar64._0_2_ |
                     ((short)uVar35 >= (short)auVar64._0_2_) * uVar35;
            uVar37 = ((short)uVar37 < (short)auVar64._2_2_) * auVar64._2_2_ |
                     ((short)uVar37 >= (short)auVar64._2_2_) * uVar37;
            uVar38 = ((short)uVar38 < (short)auVar64._4_2_) * auVar64._4_2_ |
                     ((short)uVar38 >= (short)auVar64._4_2_) * uVar38;
            uVar39 = ((short)uVar39 < (short)auVar64._6_2_) * auVar64._6_2_ |
                     ((short)uVar39 >= (short)auVar64._6_2_) * uVar39;
            uVar40 = ((short)uVar40 < (short)auVar64._8_2_) * auVar64._8_2_ |
                     ((short)uVar40 >= (short)auVar64._8_2_) * uVar40;
            uVar41 = ((short)uVar41 < (short)auVar64._10_2_) * auVar64._10_2_ |
                     ((short)uVar41 >= (short)auVar64._10_2_) * uVar41;
            uVar42 = ((short)uVar42 < (short)auVar64._12_2_) * auVar64._12_2_ |
                     ((short)uVar42 >= (short)auVar64._12_2_) * uVar42;
            uVar43 = ((short)uVar43 < (short)auVar64._14_2_) * auVar64._14_2_ |
                     ((short)uVar43 >= (short)auVar64._14_2_) * uVar43;
            sVar65 = auVar64._14_2_ + (sVar26 - sVar22);
            uVar44 = (sVar65 < (short)uVar43) * uVar43 | (ushort)(sVar65 >= (short)uVar43) * sVar65;
          }
          palVar14 = ptr_00 + uVar13;
          *(ushort *)*palVar14 = uVar35;
          *(ushort *)((long)*palVar14 + 2) = uVar37;
          *(ushort *)((long)*palVar14 + 4) = uVar38;
          *(ushort *)((long)*palVar14 + 6) = uVar39;
          *(ushort *)(*palVar14 + 1) = uVar40;
          *(ushort *)((long)*palVar14 + 10) = uVar41;
          *(ushort *)((long)*palVar14 + 0xc) = uVar42;
          *(ushort *)((long)*palVar14 + 0xe) = uVar43;
          piVar2 = ((ppVar4->field_4).rowcols)->score_row;
          piVar2[uVar13 * 8 * uVar5 + uVar9] = (int)(short)uVar35;
          piVar2[(uVar13 * 8 + 1) * uVar5 + uVar9] = (int)(short)uVar37;
          piVar2[(uVar13 * 8 + 2) * uVar5 + uVar9] = (int)(short)uVar38;
          palVar14 = ptr_01 + uVar13;
          piVar2[(uVar13 * 8 + 3) * uVar5 + uVar9] = (int)(short)uVar39;
          auVar36 = (undefined1  [16])alVar18 >> 0x70;
          piVar2[(uVar13 * 8 + 4) * uVar5 + uVar9] = (int)(short)uVar40;
          piVar2[(uVar13 * 8 + 5) * uVar5 + uVar9] = (int)(short)uVar41;
          piVar2[(uVar13 * 8 + 6) * uVar5 + uVar9] = (int)(short)uVar42;
          piVar2[(uVar13 * 8 + 7) * uVar5 + uVar9] = (int)(short)uVar43;
          sVar65 = auVar25._0_2_;
          auVar24._0_2_ =
               (sVar65 < (short)uVar35) * uVar35 | (ushort)(sVar65 >= (short)uVar35) * sVar65;
          sVar65 = auVar25._2_2_;
          auVar24._2_2_ =
               (sVar65 < (short)uVar37) * uVar37 | (ushort)(sVar65 >= (short)uVar37) * sVar65;
          sVar65 = auVar25._4_2_;
          auVar24._4_2_ =
               (sVar65 < (short)uVar38) * uVar38 | (ushort)(sVar65 >= (short)uVar38) * sVar65;
          sVar65 = auVar25._6_2_;
          auVar24._6_2_ =
               (sVar65 < (short)uVar39) * uVar39 | (ushort)(sVar65 >= (short)uVar39) * sVar65;
          sVar65 = auVar25._8_2_;
          auVar24._8_2_ =
               (sVar65 < (short)uVar40) * uVar40 | (ushort)(sVar65 >= (short)uVar40) * sVar65;
          sVar65 = auVar25._10_2_;
          auVar24._10_2_ =
               (sVar65 < (short)uVar41) * uVar41 | (ushort)(sVar65 >= (short)uVar41) * sVar65;
          sVar65 = auVar25._12_2_;
          sVar47 = auVar25._14_2_;
          auVar24._12_2_ =
               (sVar65 < (short)uVar42) * uVar42 | (ushort)(sVar65 >= (short)uVar42) * sVar65;
          auVar24._14_2_ =
               (sVar47 < (short)uVar43) * uVar43 | (ushort)(sVar47 >= (short)uVar43) * sVar47;
          sVar65 = uVar35 - auVar19._0_2_;
          sVar47 = uVar37 - auVar19._2_2_;
          sVar48 = uVar38 - auVar19._4_2_;
          sVar49 = uVar39 - auVar19._6_2_;
          sVar50 = uVar40 - auVar19._8_2_;
          sVar51 = uVar41 - auVar19._10_2_;
          sVar52 = uVar42 - auVar19._12_2_;
          sVar53 = uVar43 - sVar26;
          sVar27 = sVar27 - sVar20;
          sVar28 = sVar28 - auVar21._2_2_;
          sVar29 = sVar29 - auVar21._4_2_;
          sVar30 = sVar30 - auVar21._6_2_;
          sVar31 = sVar31 - auVar21._8_2_;
          sVar32 = sVar32 - auVar21._10_2_;
          sVar33 = sVar33 - auVar21._12_2_;
          sVar34 = sVar34 - sVar22;
          *(ushort *)*palVar14 =
               (ushort)(sVar27 < sVar65) * sVar65 | (ushort)(sVar27 >= sVar65) * sVar27;
          *(ushort *)((long)*palVar14 + 2) =
               (ushort)(sVar28 < sVar47) * sVar47 | (ushort)(sVar28 >= sVar47) * sVar28;
          *(ushort *)((long)*palVar14 + 4) =
               (ushort)(sVar29 < sVar48) * sVar48 | (ushort)(sVar29 >= sVar48) * sVar29;
          *(ushort *)((long)*palVar14 + 6) =
               (ushort)(sVar30 < sVar49) * sVar49 | (ushort)(sVar30 >= sVar49) * sVar30;
          *(ushort *)(*palVar14 + 1) =
               (ushort)(sVar31 < sVar50) * sVar50 | (ushort)(sVar31 >= sVar50) * sVar31;
          *(ushort *)((long)*palVar14 + 10) =
               (ushort)(sVar32 < sVar51) * sVar51 | (ushort)(sVar32 >= sVar51) * sVar32;
          *(ushort *)((long)*palVar14 + 0xc) =
               (ushort)(sVar33 < sVar52) * sVar52 | (ushort)(sVar33 >= sVar52) * sVar33;
          *(ushort *)((long)*palVar14 + 0xe) =
               (ushort)(sVar34 < sVar53) * sVar53 | (ushort)(sVar34 >= sVar53) * sVar34;
          uVar13 = uVar13 + 1;
          auVar25 = auVar24;
        } while (uVar13 != uVar6);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar5);
  }
  iVar7 = -0x4000;
  iVar8 = 8;
  do {
    uVar5 = auVar24._0_8_;
    lVar11 = auVar24._8_8_;
    iVar3 = (int)auVar24._14_2_;
    if (auVar24._14_2_ < iVar7) {
      iVar3 = iVar7;
    }
    iVar7 = iVar3;
    auVar24._0_8_ = uVar5 << 0x10;
    auVar24._8_8_ = lVar11 << 0x10 | uVar5 >> 0x30;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  ppVar4->score = iVar7;
  ppVar4->flag = ppVar4->flag | 0x8222004;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  return ppVar4;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    const int32_t n = 24; /* number of amino acids in table */
    const int32_t segWidth = 8; /* number of values in vector unit */
    const int32_t segLen = (s1Len + segWidth - 1) / segWidth;
    __m128i* const restrict vProfile = parasail_memalign___m128i(16, n * segLen);
    __m128i* restrict pvH = parasail_memalign___m128i(16, segLen);
    __m128i* const restrict pvE = parasail_memalign___m128i(16, segLen);
    int score = NEG_INF_16;
    __m128i vGapO = _mm_set1_epi16(open);
    __m128i vGapE = _mm_set1_epi16(gap);
    __m128i vZero = _mm_setzero_si128();
    __m128i vNegInf = _mm_set1_epi16(NEG_INF_16);
    __m128i vMaxH = vZero;
#ifdef PARASAIL_TABLE
    parasail_result_t *result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    parasail_result_t *result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
    const int32_t offset = segLen - 1;
    const int32_t position = s1Len % segWidth;
#else
    parasail_result_t *result = parasail_result_new();
#endif
#endif

    /* Generate query profile.
     * Rearrange query sequence & calculate the weight of match/mismatch.
     * Don't alias. */
    {
        int32_t index = 0;
        for (k=0; k<n; ++k) {
            for (i=0; i<segLen; ++i) {
                __m128i_16_t t;
                j = i*segWidth;
                for (segNum=0; segNum<segWidth; ++segNum) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[j]]];
                    j += 1;
                }
                _mm_store_si128(&vProfile[index], t.m);
                ++index;
            }
        }
    }

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                h.v[segNum] = 0;
                e.v[segNum] = -open;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vX = vZero;
        __m128i vF = vNegInf;
        const __m128i* pvP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        for (i=0; i<segLen; ++i) {
            __m128i vP;
            __m128i vH;
            __m128i vE;
            __m128i vT1;

            vH = _mm_load_si128(pvH + i);
            vE = _mm_load_si128(pvE + i);

            vT1 = _mm_srli_si128(vH, 14); /* rshift 3 */
            vH = _mm_slli_si128(vH, 2); /* lshift 1 */
            vH = _mm_or_si128(vH, vX);
            vX = vT1;

            vP = _mm_load_si128(pvP + i);
            vH = _mm_add_epi16(vH, vP);
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vZero);

            vF = _mm_srli_si128(vF, 14);
            vF = _mm_or_si128(vF, _mm_slli_si128(vH, 2));
            vF = _mm_sub_epi16(vF, vGapO);
            if (_mm_movemask_epi8(_mm_cmpgt_epi16(vF, vZero))) {
                __m128i vT2 = vF;
                while (_mm_movemask_epi8(_mm_cmpgt_epi16(vT2, vZero))) {
                    vT2 = _mm_slli_si128(vT2, 2);
                    vT2 = _mm_sub_epi16(vT2, vGapE);
                    vF = _mm_max_epi16(vF, vT2);
                }
                vH = _mm_max_epi16(vH, vF);
                vF = _mm_add_epi16(vF, vGapO);
                vF = _mm_sub_epi16(vF, vGapE);
                vF = _mm_max_epi16(vH, vF);
            }
            else {
                vF = vH;
            }

            _mm_store_si128(pvH + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segWidth, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vMaxH, vH);

            vH = _mm_sub_epi16(vH, vGapO);
            vE = _mm_sub_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segWidth);
    }
#endif

    /* max in vec */
    for (j=0; j<segWidth; ++j) {
        int16_t value = (int16_t) _mm_extract_epi16(vMaxH, 7);
        if (value > score) {
            score = value;
        }
        vMaxH = _mm_slli_si128(vMaxH, 2);
    }

    result->score = score;
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_BLOCKED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    parasail_free(pvE);
    parasail_free(pvH);
    parasail_free(vProfile);

    return result;
}